

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O3

AssimpVertexBoneWeightList * __thiscall
Assimp::Ogre::IVertexData::AssimpBoneWeights
          (AssimpVertexBoneWeightList *__return_storage_ptr__,IVertexData *this,size_t vertices)

{
  _Rb_tree_header *p_Var1;
  pointer pVVar2;
  mapped_type *pmVar3;
  mapped_type *this_00;
  uint16_t *__k;
  pointer pVVar4;
  size_t sVar5;
  uint local_44;
  VertexBoneAssignmentsMap *local_40;
  aiVertexWeight local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (vertices != 0) {
    local_40 = &this->boneAssignmentsMap;
    sVar5 = 0;
    do {
      local_44 = (uint)sVar5;
      pmVar3 = std::
               map<unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>_>_>_>
               ::operator[](local_40,&local_44);
      pVVar4 = (pmVar3->
               super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pVVar2 = (pmVar3->
               super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pVVar4 != pVVar2) {
        __k = &pVVar4->boneIndex;
        do {
          this_00 = std::
                    map<unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                    ::operator[](__return_storage_ptr__,__k);
          local_38.mWeight = *(float *)(__k + 2);
          local_38.mVertexId = (uint)sVar5;
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::emplace_back<aiVertexWeight>
                    (this_00,&local_38);
          pVVar4 = (pointer)(__k + 4);
          __k = __k + 6;
        } while (pVVar4 != pVVar2);
      }
      sVar5 = sVar5 + 1;
    } while (sVar5 != vertices);
  }
  return __return_storage_ptr__;
}

Assistant:

AssimpVertexBoneWeightList IVertexData::AssimpBoneWeights(size_t vertices)
{
    AssimpVertexBoneWeightList weights;
    for(size_t vi=0; vi<vertices; ++vi)
    {
        VertexBoneAssignmentList &vertexWeights = boneAssignmentsMap[static_cast<unsigned int>(vi)];
        for (VertexBoneAssignmentList::const_iterator iter=vertexWeights.begin(), end=vertexWeights.end();
            iter!=end; ++iter)
        {
            std::vector<aiVertexWeight> &boneWeights = weights[iter->boneIndex];
            boneWeights.push_back(aiVertexWeight(static_cast<unsigned int>(vi), iter->weight));
        }
    }
    return weights;
}